

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpginput.cc
# Opt level: O1

void __thiscall JpegInput::readHeader(JpegInput *this)

{
  undefined8 uVar1;
  jpeg_decoder *this_00;
  runtime_error *prVar2;
  code *pcVar3;
  pointer_____offset_0x10___ *ppuVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  jpgd_status errorCode;
  jpgd_status *local_b8;
  code *local_b0;
  ImageSpec local_a8;
  
  this_00 = (jpeg_decoder *)operator_new(0x34d8);
  jpgd::jpeg_decoder::jpeg_decoder(this_00,(jpeg_decoder_stream *)&this->jstream,1);
  this->pJd = this_00;
  errorCode = this_00->m_error_code;
  if (errorCode == JPGD_SUCCESS) {
    uVar1._0_4_ = this_00->m_image_x_size;
    uVar1._4_4_ = this_00->m_image_y_size;
    FormatDescriptor::FormatDescriptor
              (&local_a8.formatDesc,this_00->m_comps_in_frame,8,0,KHR_DF_TRANSFER_SCRGB,
               KHR_DF_PRIMARIES_BT709,KHR_DF_MODEL_RGBSDA,KHR_DF_FLAG_ALPHA_STRAIGHT);
    local_a8.imageDepth = 1;
    local_a8.imageOrigin.x = '\0';
    local_a8.imageOrigin.y = '\0';
    local_a8.imageOrigin.z = '\0';
    local_b8 = (jpgd_status *)CONCAT44(local_b8._4_4_,7);
    local_a8._112_8_ = uVar1;
    std::vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>>::
    emplace_back<ImageSpec,ImageInputFormatType>
              ((vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>> *)
               &(this->super_ImageInput).images,&local_a8,(ImageInputFormatType *)&local_b8);
    if (local_a8.formatDesc.samples.
        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.formatDesc.samples.
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.formatDesc.samples.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.formatDesc.samples.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.formatDesc.extended.iccProfile.profile.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.formatDesc.extended.iccProfile.profile.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.formatDesc.extended.iccProfile.profile.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.formatDesc.extended.iccProfile.profile.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.formatDesc.extended.iccProfile.name._M_dataplus._M_p !=
        &local_a8.formatDesc.extended.iccProfile.name.field_2) {
      operator_delete(local_a8.formatDesc.extended.iccProfile.name._M_dataplus._M_p,
                      local_a8.formatDesc.extended.iccProfile.name.field_2._M_allocated_capacity + 1
                     );
    }
    return;
  }
  if (errorCode == JPGD_NOTENOUGHMEM) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JPEG decoder out of memory");
    ppuVar4 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
    pcVar3 = std::runtime_error::~runtime_error;
  }
  else {
    if (errorCode != JPGD_NOT_JPEG) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b8 = &errorCode;
      local_b0 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                 ::
                 format_custom_arg<jpgd::jpgd_status,fmt::v10::formatter<jpgd::jpgd_status,char,void>>
      ;
      fmt.size_ = 0xf;
      fmt.data_ = (char *)0x16;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_b8;
      ::fmt::v10::vformat_abi_cxx11_((string *)&local_a8,(v10 *)"JPEG decode failed: {}",fmt,args);
      std::runtime_error::runtime_error(prVar2,(string *)&local_a8);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ImageInput::different_format::different_format((different_format *)prVar2);
    ppuVar4 = &ImageInput::different_format::typeinfo;
    pcVar3 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(prVar2,ppuVar4,pcVar3);
}

Assistant:

void
JpegInput::readHeader()
{
    pJd = new jpeg_decoder(&jstream, jpeg_decoder::cFlagLinearChromaFiltering);
    jpgd_status errorCode = pJd->get_error_code();

    if (errorCode != JPGD_SUCCESS) {
        if (errorCode == JPGD_NOT_JPEG) {
            throw different_format();
        } else if (errorCode == JPGD_NOTENOUGHMEM) {
            throw std::runtime_error("JPEG decoder out of memory");
        } else {
            throw std::runtime_error(
                fmt::format("JPEG decode failed: {}", errorCode)
            );
        }
    }
    // At this point we cannot use
    // - jd.get_bytes_per_pixel
    // - jd.get_bytes_per_scan_line
    // because the underlying variables are not initialized until
    // begin_decoding is called. In any case these are not helpful as they
    // return what the decode() method will return not what is in the file.

    images.emplace_back(ImageSpec(pJd->get_width(), pJd->get_height(), 1,
                                ImageSpec::Origin(ImageSpec::Origin::eLeft, ImageSpec::Origin::eTop),
                                pJd->get_num_components(), 8, // component bit length
                                static_cast<khr_df_sample_datatype_qualifiers_e>(0),
                                KHR_DF_TRANSFER_SRGB,
                                KHR_DF_PRIMARIES_BT709),
                        ImageInputFormatType::jpg);
}